

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_suite.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  
  move_null_to_array();
  move_boolean_to_array();
  move_integer_to_array();
  move_real_to_array();
  move_string_to_array();
  move_wstring_to_array();
  move_u16string_to_array();
  move_u32string_to_array();
  move_array_to_array();
  move_null_to_vector();
  move_boolean_to_vector();
  move_integer_to_vector();
  move_real_to_vector();
  move_string_to_vector();
  move_wstring_to_vector();
  move_u16string_to_vector();
  move_u32string_to_vector();
  move_array_to_vector();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    move_null_to_array();
    move_boolean_to_array();
    move_integer_to_array();
    move_real_to_array();
    move_string_to_array();
    move_wstring_to_array();
    move_u16string_to_array();
    move_u32string_to_array();
    move_array_to_array();

    move_null_to_vector();
    move_boolean_to_vector();
    move_integer_to_vector();
    move_real_to_vector();
    move_string_to_vector();
    move_wstring_to_vector();
    move_u16string_to_vector();
    move_u32string_to_vector();
    move_array_to_vector();

    return boost::report_errors();
}